

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O1

void cfd::core::logger::log<cfd::SignDataType&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,SignDataType *args)

{
  char cVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  ulong local_38 [2];
  
  cVar1 = cfd::core::logger::IsEnableLogLevel(lvl);
  if (cVar1 != '\0') {
    local_38[0] = (ulong)*args;
    sVar2 = strlen(fmt);
    ::fmt::v7::detail::vformat_abi_cxx11_(local_58,fmt,sVar2,2,local_38);
    cfd::core::logger::WriteLog(source,lvl,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}